

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_types.cpp
# Opt level: O1

void BanMapFromJson(UniValue *bans_json,banmap_t *bans)

{
  pointer pUVar1;
  string_view source_file;
  string_view source_file_00;
  bool bVar2;
  int iVar3;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar4;
  UniValue *pUVar5;
  string *subnet_str;
  Logger *pLVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *__end;
  pointer this;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  int version;
  CSubNet subnet;
  string log_msg_1;
  int local_118 [2];
  direct_or_indirect local_110;
  uint local_100;
  undefined4 uStack_fc;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar4 = UniValue::getValues(bans_json);
  this = (pvVar4->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pUVar1 = (pvVar4->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (this != pUVar1) {
    do {
      local_110.indirect_contents.indirect = (char *)&local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"version","");
      pUVar5 = UniValue::operator[](this,(string *)&local_110.indirect_contents);
      iVar3 = UniValue::getInt<int>(pUVar5);
      if ((uint *)local_110.indirect_contents.indirect != &local_100) {
        operator_delete(local_110.indirect_contents.indirect,CONCAT44(uStack_fc,local_100) + 1);
      }
      local_118[0] = iVar3;
      if (iVar3 == 1) {
        local_110.indirect_contents.indirect = (char *)&local_100;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"address","");
        pUVar5 = UniValue::operator[](this,(string *)&local_110.indirect_contents);
        subnet_str = UniValue::get_str_abi_cxx11_(pUVar5);
        if ((uint *)local_110.indirect_contents.indirect != &local_100) {
          operator_delete(local_110.indirect_contents.indirect,CONCAT44(uStack_fc,local_100) + 1);
        }
        LookupSubNet((CSubNet *)&local_110.indirect_contents,subnet_str);
        bVar2 = CSubNet::IsValid((CSubNet *)&local_110.indirect_contents);
        if (bVar2) {
          CBanEntry::CBanEntry((CBanEntry *)&local_58,this);
          std::
          map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
          ::insert_or_assign<CBanEntry>
                    (bans,(key_type *)&local_110.indirect_contents,(CBanEntry *)&local_58);
        }
        else {
          pLVar6 = LogInstance();
          bVar2 = BCLog::Logger::Enabled(pLVar6);
          if (bVar2) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            tinyformat::format<std::__cxx11::string>
                      (&local_78,
                       (tinyformat *)
                       "Dropping entry with unparseable address or subnet (%s) from ban list\n",
                       (char *)subnet_str,in_RCX);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_58,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            pLVar6 = LogInstance();
            local_78._M_dataplus._M_p = (pointer)0x56;
            local_78._M_string_length = 0x1162ab5;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_types.cpp"
            ;
            source_file_00._M_len = 0x56;
            str_00._M_str = local_58._M_dataplus._M_p;
            str_00._M_len = local_58._M_string_length;
            logging_function_00._M_str = "BanMapFromJson";
            logging_function_00._M_len = 0xe;
            in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe;
            BCLog::Logger::LogPrintStr
                      (pLVar6,str_00,logging_function_00,source_file_00,0x45,ALL,Info);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        if (0x10 < local_100) {
          free(local_110.indirect_contents.indirect);
          local_110.indirect_contents.indirect = (char *)0x0;
        }
      }
      else {
        pLVar6 = LogInstance();
        bVar2 = BCLog::Logger::Enabled(pLVar6);
        if (bVar2) {
          local_110._8_8_ = 0;
          local_100 = local_100 & 0xffffff00;
          local_110.indirect_contents.indirect = (char *)&local_100;
          tinyformat::format<int>
                    (&local_58,"Dropping entry with unknown version (%s) from ban list\n",local_118)
          ;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_110.indirect_contents,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
          pLVar6 = LogInstance();
          local_58._M_dataplus._M_p = (pointer)0x56;
          local_58._M_string_length = 0x1162ab5;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_types.cpp"
          ;
          source_file._M_len = 0x56;
          str._M_str = local_110.indirect_contents.indirect;
          str._M_len = local_110._8_8_;
          logging_function._M_str = "BanMapFromJson";
          logging_function._M_len = 0xe;
          in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe;
          BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x3f,ALL,Info);
          if ((uint *)local_110.indirect_contents.indirect != &local_100) {
            operator_delete(local_110.indirect_contents.indirect,CONCAT44(uStack_fc,local_100) + 1);
          }
        }
      }
      this = this + 1;
    } while (this != pUVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BanMapFromJson(const UniValue& bans_json, banmap_t& bans)
{
    for (const auto& ban_entry_json : bans_json.getValues()) {
        const int version{ban_entry_json[BANMAN_JSON_VERSION_KEY].getInt<int>()};
        if (version != CBanEntry::CURRENT_VERSION) {
            LogPrintf("Dropping entry with unknown version (%s) from ban list\n", version);
            continue;
        }
        const auto& subnet_str = ban_entry_json[BANMAN_JSON_ADDR_KEY].get_str();
        const CSubNet subnet{LookupSubNet(subnet_str)};
        if (!subnet.IsValid()) {
            LogPrintf("Dropping entry with unparseable address or subnet (%s) from ban list\n", subnet_str);
            continue;
        }
        bans.insert_or_assign(subnet, CBanEntry{ban_entry_json});
    }
}